

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SBGInterface.cpp
# Opt level: O0

void * SBGInterfaceThread(void *pParam)

{
  bool bVar1;
  int iVar2;
  BOOL bConnected;
  void *pParam_local;
  
  if ((szSBGInterfacePath[0] == ':') && (iVar2 = atoi(szSBGInterfacePath + 1), 0 < iVar2)) {
    SBGInterfacePseudoRS232Port.DevType = 2;
    do {
      iVar2 = LaunchMultiCliTCPSrv(szSBGInterfacePath + 1,handlesbginterfacecli,(void *)0x0);
      if (iVar2 == 0) break;
      printf("Error launching the SBGInterface server.\n");
      mSleep(4000);
    } while (bExit == 0);
  }
  else {
    bVar1 = false;
    do {
      if (bVar1) {
        iVar2 = handlesbginterface(&SBGInterfacePseudoRS232Port);
        if (iVar2 != 0) {
          printf("Connection to a SBGInterface lost.\n");
          bVar1 = false;
          disconnectsbginterface(&SBGInterfacePseudoRS232Port);
          uSleep(20000);
        }
      }
      else {
        iVar2 = connectsbginterface(&SBGInterfacePseudoRS232Port);
        if (iVar2 != 0) {
          mSleep(1000);
        }
        else {
          uSleep(20000);
          inithandlesbginterface(&SBGInterfacePseudoRS232Port);
        }
        bVar1 = iVar2 == 0;
      }
    } while (bExit == 0);
    if (bVar1) {
      disconnectsbginterface(&SBGInterfacePseudoRS232Port);
    }
  }
  if (bExit == 0) {
    bExit = 1;
  }
  return (void *)0x0;
}

Assistant:

THREAD_PROC_RETURN_VALUE SBGInterfaceThread(void* pParam)
{
	//CHRONO chrono;
	//double dt = 0, t = 0, t0 = 0;
	//struct timeval tv;

	UNREFERENCED_PARAMETER(pParam);

	//EnterCriticalSection(&strtimeCS);
	//sprintf(sbginterfacefilename, LOG_FOLDER"sbginterface_%.64s.txt", strtimeex_fns());
	//LeaveCriticalSection(&strtimeCS);
	//sbginterfacefile = fopen(sbginterfacefilename, "w");
	//if (sbginterfacefile == NULL)
	//{
	//	printf("Unable to create sbginterface file.\n");
	//	if (!bExit) bExit = TRUE; // Unexpected program exit...
	//	return 0;
	//}

	// Try to determine whether it is a server TCP port.
	if ((szSBGInterfacePath[0] == ':')&&(atoi(szSBGInterfacePath+1) > 0))
	{
		SBGInterfacePseudoRS232Port.DevType = TCP_SERVER_TYPE_RS232PORT;
		while (LaunchMultiCliTCPSrv(szSBGInterfacePath+1, handlesbginterfacecli, NULL) != EXIT_SUCCESS)
		{
			printf("Error launching the SBGInterface server.\n");
			mSleep(4000);
			if (bExit) break;
		}
	}
	else
	{
		BOOL bConnected = FALSE;

		//t = 0;

		//StartChrono(&chrono);

		for (;;)
		{
			//uSleep(1000*20);
			//t0 = t;
			//GetTimeElapsedChrono(&chrono, &t);
			//dt = t-t0;

			//printf("SBGInterfaceThread period : %f s.\n", dt);

			if (!bConnected)
			{
				if (connectsbginterface(&SBGInterfacePseudoRS232Port) == EXIT_SUCCESS) 
				{
					uSleep(1000*20);
					bConnected = TRUE; 

					inithandlesbginterface(&SBGInterfacePseudoRS232Port);
				}
				else 
				{
					bConnected = FALSE;
					mSleep(1000);
				}
			}
			else
			{
				//// Time...
				//if (gettimeofday(&tv, NULL) != EXIT_SUCCESS)
				//{
				//	tv.tv_sec = 0;
				//	tv.tv_usec = 0;
				//}

				if (handlesbginterface(&SBGInterfacePseudoRS232Port) != EXIT_SUCCESS)
				{
					printf("Connection to a SBGInterface lost.\n");
					bConnected = FALSE;
					disconnectsbginterface(&SBGInterfacePseudoRS232Port);
					uSleep(1000*20);
				}
			}

			if (bExit) break;
		}

		//StopChrono(&chrono, &t);

		if (bConnected) disconnectsbginterface(&SBGInterfacePseudoRS232Port);
	}

	//fclose(sbginterfacefile);

	if (!bExit) bExit = TRUE; // Unexpected program exit...

	return 0;
}